

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::PerspectiveCamera::GenerateRayDifferential
          (PerspectiveCamera *this,CameraSample *sample,SampledWavelengths *lambda)

{
  long in_RSI;
  optional<pbrt::CameraRayDifferential> *in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  Point3<float> PVar27;
  Vector3<float> VVar28;
  Point3f PVar29;
  Vector3f dy;
  Point3f pFocus_1;
  Float ft_1;
  Vector3f dx;
  Point2f pLens_1;
  Point3f pFocus;
  Float ft;
  Point2f pLens;
  RayDifferential ray;
  Vector3f dir;
  Point3f pCamera;
  Point3f pFilm;
  float in_stack_fffffffffffffb38;
  Float in_stack_fffffffffffffb3c;
  CameraBase *in_stack_fffffffffffffb40;
  CameraBase *in_stack_fffffffffffffb48;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffb50;
  Tuple3<pbrt::Vector3,_float> *this_00;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 uVar30;
  Vector3<float> *in_stack_fffffffffffffb60;
  Vector3<float> *v;
  undefined8 in_stack_fffffffffffffb68;
  Float time;
  Vector3f *in_stack_fffffffffffffb70;
  Point3f *in_stack_fffffffffffffb78;
  RayDifferential *in_stack_fffffffffffffb80;
  Tuple3<pbrt::Vector3,_float> local_394;
  undefined8 local_388;
  float local_380;
  Float local_37c [2];
  float local_374;
  Float local_370 [2];
  float local_368;
  Float local_360 [4];
  undefined1 local_34c [52];
  Float in_stack_fffffffffffffce8;
  Float in_stack_fffffffffffffcec;
  Transform *in_stack_fffffffffffffcf0;
  undefined8 local_2e4;
  Float local_2dc;
  undefined8 local_20c;
  Float local_204;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  undefined1 local_168 [16];
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined1 local_130 [20];
  Float local_11c;
  DerivativeTerm local_118;
  DerivativeTerm local_108 [3];
  undefined1 local_d0 [20];
  float local_bc;
  undefined1 local_a8;
  undefined1 local_a4 [20];
  Float local_90;
  Float local_8c [2];
  float local_84;
  Float local_80 [2];
  float local_78;
  Float local_70 [2];
  float local_68;
  Float local_54 [2];
  float local_4c;
  Float local_48 [2];
  float local_40;
  undefined8 local_38;
  float local_30;
  undefined1 auVar26 [56];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  time = (Float)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  auVar26 = (undefined1  [56])0x0;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
             in_stack_fffffffffffffb38,0.0);
  PVar27 = Transform::operator()
                     (in_stack_fffffffffffffcf0,
                      (Point3<float> *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
                     );
  local_40 = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar26;
  local_48 = (Float  [2])vmovlpd_avx(auVar1._0_16_);
  auVar26 = (undefined1  [56])0x0;
  local_38 = local_48;
  local_30 = local_40;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
             in_stack_fffffffffffffb38,0.0);
  VVar28 = Normalize<float>(in_stack_fffffffffffffb60);
  local_68 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar26;
  local_70 = (Float  [2])vmovlpd_avx(auVar2._0_16_);
  local_54 = local_70;
  local_4c = local_68;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
             in_stack_fffffffffffffb38,0.0);
  CameraBase::SampleTime(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
  MediumHandle::MediumHandle
            ((MediumHandle *)in_stack_fffffffffffffb40,
             (MediumHandle *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  RayDifferential::RayDifferential
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,time,
             (MediumHandle *)in_stack_fffffffffffffb60);
  if (0.0 < *(float *)(in_RSI + 0x580)) {
    auVar3._0_8_ = SampleUniformDiskConcentric((Point2f *)in_stack_fffffffffffffb78);
    auVar3._8_56_ = extraout_var;
    local_108[1]._0_8_ = vmovlpd_avx(auVar3._0_16_);
    auVar4._0_8_ = pbrt::operator*(in_stack_fffffffffffffb3c,(Tuple2<pbrt::Point2,_float> *)0x740d82
                                  );
    auVar4._8_56_ = extraout_var_00;
    local_108[1]._8_8_ = vmovlpd_avx(auVar4._0_16_);
    local_108[0].kz = *(float *)(in_RSI + 0x584) / local_bc;
    auVar26 = (undefined1  [56])0x0;
    PVar29 = Ray::operator()(&in_stack_fffffffffffffb80->super_Ray,
                             (Float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    local_118.ky = PVar29.super_Tuple3<pbrt::Point3,_float>.z;
    auVar5._0_8_ = PVar29.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar5._8_56_ = auVar26;
    local_118._0_8_ = vmovlpd_avx(auVar5._0_16_);
    auVar26 = (undefined1  [56])0x0;
    local_108[0]._0_8_ = local_118._0_8_;
    local_108[0].ky = local_118.ky;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb38,0.0);
    local_d0._8_4_ = local_11c;
    local_d0._0_8_ = local_130._12_8_;
    VVar28 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffffb50,
                        (Point3<float> *)in_stack_fffffffffffffb48);
    local_148 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar26;
    local_150 = vmovlpd_avx(auVar6._0_16_);
    local_140 = local_150;
    local_138 = local_148;
    VVar28 = Normalize<float>(in_stack_fffffffffffffb60);
    local_158 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar26;
    local_168._8_8_ = vmovlpd_avx(auVar7._0_16_);
    local_130._0_8_ = local_168._8_8_;
    local_130._8_4_ = local_158;
    local_d0._12_8_ = local_168._8_8_;
    local_bc = local_158;
  }
  auVar26 = (undefined1  [56])0x0;
  if (*(float *)(in_RSI + 0x580) <= 0.0) {
    local_90 = (Float)local_d0._8_4_;
    local_a4._12_8_ = local_d0._0_8_;
    local_a4._8_4_ = local_d0._8_4_;
    local_a4._0_8_ = local_d0._0_8_;
    in_stack_fffffffffffffb40 = (CameraBase *)local_34c;
    in_stack_fffffffffffffb48 = (CameraBase *)&stack0xffffffffffffffc8;
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)in_stack_fffffffffffffb40,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    VVar28 = Tuple3<pbrt::Vector3,float>::operator+
                       (in_stack_fffffffffffffb50,(Vector3<float> *)in_stack_fffffffffffffb48);
    local_360[2] = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar22._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar22._8_56_ = auVar26;
    local_360._0_8_ = vmovlpd_avx(auVar22._0_16_);
    local_34c._12_8_ = local_360._0_8_;
    local_34c._20_4_ = local_360[2];
    VVar28 = Normalize<float>(in_stack_fffffffffffffb60);
    local_368 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar23._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar23._8_56_ = auVar26;
    local_370 = (Float  [2])vmovlpd_avx(auVar23._0_16_);
    this_00 = &local_394;
    local_34c._28_8_ = local_370;
    local_34c._36_4_ = local_368;
    local_8c = local_370;
    local_84 = local_368;
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)in_stack_fffffffffffffb40,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    VVar28 = Tuple3<pbrt::Vector3,float>::operator+
                       (this_00,(Vector3<float> *)in_stack_fffffffffffffb48);
    local_380 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar24._8_56_ = auVar26;
    local_388 = vmovlpd_avx(auVar24._0_16_);
    VVar28 = Normalize<float>(in_stack_fffffffffffffb60);
    local_374 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar25._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar25._8_56_ = auVar26;
    local_37c = (Float  [2])vmovlpd_avx(auVar25._0_16_);
    local_80 = local_37c;
    local_78 = local_374;
  }
  else {
    uVar30 = *(undefined4 *)(in_RSI + 0x580);
    auVar8._0_8_ = SampleUniformDiskConcentric((Point2f *)in_stack_fffffffffffffb78);
    auVar8._8_56_ = extraout_var_01;
    local_170 = vmovlpd_avx(auVar8._0_16_);
    auVar9._0_8_ = pbrt::operator*(in_stack_fffffffffffffb3c,(Tuple2<pbrt::Point2,_float> *)0x740f3f
                                  );
    auVar9._8_56_ = extraout_var_02;
    local_168._0_8_ = vmovlpd_avx(auVar9._0_16_);
    auVar26 = extraout_var_02;
    PVar27 = Point3<float>::operator+
                       ((Point3<float> *)in_stack_fffffffffffffb50,
                        (Vector3<float> *)in_stack_fffffffffffffb48);
    auVar10._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar26;
    vmovlpd_avx(auVar10._0_16_);
    v = (Vector3<float> *)&stack0xfffffffffffffe74;
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)in_stack_fffffffffffffb40,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    VVar28 = Normalize<float>(v);
    local_178 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar26;
    local_180 = vmovlpd_avx(auVar11._0_16_);
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb38,0.0);
    auVar26 = (undefined1  [56])0x0;
    VVar28 = pbrt::operator*((float)((ulong)v >> 0x20),
                             (Tuple3<pbrt::Vector3,_float> *)
                             CONCAT44(uVar30,in_stack_fffffffffffffb58));
    auVar12._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar26;
    vmovlpd_avx(auVar12._0_16_);
    PVar27 = Point3<float>::operator+
                       ((Point3<float> *)in_stack_fffffffffffffb50,
                        (Vector3<float> *)in_stack_fffffffffffffb48);
    auVar13._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar13._8_56_ = auVar26;
    vmovlpd_avx(auVar13._0_16_);
    auVar26 = (undefined1  [56])0x0;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb38,0.0);
    local_a4._8_4_ = local_204;
    local_a4._0_8_ = local_20c;
    VVar28 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffffb50,
                        (Point3<float> *)in_stack_fffffffffffffb48);
    auVar14._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar26;
    vmovlpd_avx(auVar14._0_16_);
    VVar28 = Normalize<float>(v);
    local_84 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar26;
    local_8c = (Float  [2])vmovlpd_avx(auVar15._0_16_);
    PVar27 = Point3<float>::operator+
                       ((Point3<float> *)in_stack_fffffffffffffb50,
                        (Vector3<float> *)in_stack_fffffffffffffb48);
    auVar16._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar26;
    vmovlpd_avx(auVar16._0_16_);
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)in_stack_fffffffffffffb40,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    VVar28 = Normalize<float>(v);
    auVar17._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar26;
    vmovlpd_avx(auVar17._0_16_);
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb38,0.0);
    auVar26 = (undefined1  [56])0x0;
    VVar28 = pbrt::operator*((float)((ulong)v >> 0x20),
                             (Tuple3<pbrt::Vector3,_float> *)
                             CONCAT44(uVar30,in_stack_fffffffffffffb58));
    auVar18._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar26;
    vmovlpd_avx(auVar18._0_16_);
    PVar27 = Point3<float>::operator+
                       ((Point3<float> *)in_stack_fffffffffffffb50,
                        (Vector3<float> *)in_stack_fffffffffffffb48);
    auVar19._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar19._8_56_ = auVar26;
    vmovlpd_avx(auVar19._0_16_);
    auVar26 = (undefined1  [56])0x0;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
               in_stack_fffffffffffffb38,0.0);
    local_90 = local_2dc;
    local_a4._12_8_ = local_2e4;
    VVar28 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffffb50,
                        (Point3<float> *)in_stack_fffffffffffffb48);
    auVar20._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar20._8_56_ = auVar26;
    vmovlpd_avx(auVar20._0_16_);
    VVar28 = Normalize<float>(v);
    local_78 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar21._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar21._8_56_ = auVar26;
    local_34c._44_8_ = vmovlpd_avx(auVar21._0_16_);
    local_80 = (Float  [2])local_34c._44_8_;
  }
  local_a8 = 1;
  CameraBase::RenderFromCamera
            (in_stack_fffffffffffffb48,(RayDifferential *)in_stack_fffffffffffffb40);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
  pstd::optional<pbrt::CameraRayDifferential>::optional
            ((optional<pbrt::CameraRayDifferential> *)in_stack_fffffffffffffb40,
             (CameraRayDifferential *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38))
  ;
  return in_RDI;
}

Assistant:

pstd::optional<CameraRayDifferential> PerspectiveCamera::GenerateRayDifferential(
    const CameraSample &sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);
    Vector3f dir = Normalize(Vector3f(pCamera.x, pCamera.y, pCamera.z));
    RayDifferential ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    // Compute offset rays for \use{PerspectiveCamera} ray differentials
    if (lensRadius > 0) {
        // Compute \use{PerspectiveCamera} ray differentials accounting for lens
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute $x$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dx = Normalize(Vector3f(pCamera + dxCamera));
        Float ft = focalDistance / dx.z;
        Point3f pFocus = Point3f(0, 0, 0) + (ft * dx);
        ray.rxOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.rxDirection = Normalize(pFocus - ray.rxOrigin);

        // Compute $y$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dy = Normalize(Vector3f(pCamera + dyCamera));
        ft = focalDistance / dy.z;
        pFocus = Point3f(0, 0, 0) + (ft * dy);
        ray.ryOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.ryDirection = Normalize(pFocus - ray.ryOrigin);

    } else {
        ray.rxOrigin = ray.ryOrigin = ray.o;
        ray.rxDirection = Normalize(Vector3f(pCamera) + dxCamera);
        ray.ryDirection = Normalize(Vector3f(pCamera) + dyCamera);
    }

    ray.hasDifferentials = true;
    return CameraRayDifferential{RenderFromCamera(ray)};
}